

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt_endpoint_refiner::refine(dxt_endpoint_refiner *this,params *p,results *r)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  color_quad_u8 *pcVar4;
  uint8 *puVar5;
  double dVar6;
  uint i_4;
  ulong uVar7;
  uint i;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  vec3F l;
  vec3F h;
  vec<3U,_double> b;
  vec<3U,_double> a;
  vec<3U,_double> betax_sum;
  vec<3U,_double> alphax_sum;
  vec<3U,_double> first_color;
  vec<3U,_double> result_4;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  double local_130;
  float local_128;
  double local_118 [4];
  double local_f8 [4];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double adStack_78 [3];
  vec3F local_60;
  double local_50;
  float local_48;
  double local_40;
  float local_38;
  double local_30;
  float local_28;
  
  if (p->m_num_pixels == 0) {
    return false;
  }
  this->m_pParams = p;
  this->m_pResults = r;
  r->m_error = 0xffffffffffffffff;
  r->m_low_color = 0;
  r->m_high_color = 0;
  local_a8 = 0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = 0;
  local_d8 = (undefined1  [16])0x0;
  local_88 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  uVar2 = p->m_num_pixels;
  if ((ulong)uVar2 == 0) {
    dVar6 = 0.0;
  }
  else {
    pcVar4 = p->m_pPixels;
    puVar5 = p->m_pSelectors;
    bVar1 = p->m_dxt1_selectors;
    uVar3 = p->m_alpha_comp_index;
    dVar6 = 0.0;
    uVar7 = 0;
    dVar10 = 0.0;
    dVar9 = 0.0;
    do {
      if (bVar1 == false) {
        local_148 = (double)((float)pcVar4[uVar7].field_0.c[uVar3] * 0.003921569);
        uStack_140 = local_148;
        local_138 = local_148;
        fVar12 = (float)*(byte *)((long)&g_dxt5_to_linear + (ulong)puVar5[uVar7]) * 0.14285715;
      }
      else {
        fVar12 = (float)(byte)(&g_dxt1_to_linear)[puVar5[uVar7]] * 0.33333334;
        local_148 = (double)((float)(*(ushort *)&pcVar4[uVar7].field_0 & 0xff) * 0.003921569);
        uStack_140 = (double)((float)(byte)(*(ushort *)&pcVar4[uVar7].field_0 >> 8) * 0.003921569);
        local_138 = (double)((float)pcVar4[uVar7].field_0.field_0.b * 0.003921569);
      }
      if (uVar7 == 0) {
        local_88 = local_138;
        local_98 = local_148;
        dStack_90 = uStack_140;
      }
      dVar11 = (double)fVar12;
      dVar13 = 1.0 - dVar11;
      lVar8 = 0;
      do {
        (&local_130)[lVar8] = (&local_148)[lVar8] * dVar13;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar10 = dVar10 + dVar11 * dVar11;
      lVar8 = 0;
      do {
        *(double *)(local_b8 + lVar8 * 8) = *(double *)(local_b8 + lVar8 * 8) + (&local_130)[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar6 = dVar6 + dVar13 * dVar13;
      lVar8 = 0;
      do {
        (&local_130)[lVar8] = (&local_148)[lVar8] * dVar11;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        *(double *)(local_d8 + lVar8 * 8) = *(double *)(local_d8 + lVar8 * 8) + (&local_130)[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar9 = dVar9 + dVar13 * dVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
    if (dVar10 != 0.0) {
      if (dVar6 == 0.0) {
        local_f8[0] = 0.0;
        local_f8[1] = 0.0;
        local_f8[2] = 0.0;
        lVar8 = 0;
        do {
          local_118[lVar8] = *(double *)(local_d8 + lVar8 * 8) * (1.0 / dVar10);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      else {
        dVar11 = dVar6 * dVar10 - dVar9 * dVar9;
        if (dVar11 == 0.0) {
          local_f8[2] = local_88;
          local_f8[0] = local_98;
          local_f8[1] = dStack_90;
          local_118[0] = local_98;
          local_118[1] = dStack_90;
          local_118[2] = local_88;
        }
        else {
          lVar8 = 0;
          do {
            (&local_130)[lVar8] = *(double *)(local_b8 + lVar8 * 8) * dVar10;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            adStack_78[lVar8] = *(double *)(local_d8 + lVar8 * 8) * dVar9;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            (&local_148)[lVar8] = (&local_130)[lVar8] - adStack_78[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          dVar11 = 1.0 / dVar11;
          lVar8 = 0;
          do {
            local_f8[lVar8] = (&local_148)[lVar8] * dVar11;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            (&local_130)[lVar8] = *(double *)(local_d8 + lVar8 * 8) * dVar6;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            adStack_78[lVar8] = *(double *)(local_b8 + lVar8 * 8) * dVar9;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            (&local_148)[lVar8] = (&local_130)[lVar8] - adStack_78[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_118[lVar8] = (&local_148)[lVar8] * dVar11;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
        }
      }
      goto LAB_0019c803;
    }
  }
  lVar8 = 0;
  do {
    local_f8[lVar8] = *(double *)(local_b8 + lVar8 * 8) * (1.0 / dVar6);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
LAB_0019c803:
  lVar8 = 0;
  uStack_140 = (double)((ulong)uStack_140._4_4_ << 0x20);
  local_148 = 0.0;
  local_128 = 0.0;
  local_130 = 0.0;
  do {
    *(float *)((long)&local_148 + lVar8 * 4) = (float)local_f8[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    *(float *)((long)&local_130 + lVar8 * 4) = (float)local_118[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    fVar12 = *(float *)((long)&local_148 + lVar8 * 4);
    if (1.0 <= fVar12) {
      fVar12 = 1.0;
    }
    if (fVar12 <= 0.0) {
      fVar12 = 0.0;
    }
    *(float *)((long)&local_148 + lVar8 * 4) = fVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    fVar12 = *(float *)((long)&local_130 + lVar8 * 4);
    if (1.0 <= fVar12) {
      fVar12 = 1.0;
    }
    if (fVar12 <= 0.0) {
      fVar12 = 0.0;
    }
    *(float *)((long)&local_130 + lVar8 * 4) = fVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (p->m_dxt1_selectors == false) {
    local_48 = (float)uStack_140;
    local_50 = local_148;
    local_60.m_s._0_8_ = local_130;
    local_60.m_s[2] = local_128;
    optimize_dxt5(this,(vec3F *)&local_50,&local_60);
  }
  else {
    local_28 = (float)uStack_140;
    local_30 = local_148;
    local_40 = local_130;
    local_38 = local_128;
    optimize_dxt1(this,(vec3F *)&local_30,(vec3F *)&local_40);
  }
  return r->m_error < p->m_error_to_beat;
}

Assistant:

bool dxt_endpoint_refiner::refine(const params& p, results& r) {
  if (!p.m_num_pixels)
    return false;

  m_pParams = &p;
  m_pResults = &r;

  r.m_error = cUINT64_MAX;
  r.m_low_color = 0;
  r.m_high_color = 0;

  double alpha2_sum = 0.0f;
  double beta2_sum = 0.0f;
  double alphabeta_sum = 0.0f;

  vec<3, double> alphax_sum(0.0f);
  vec<3, double> betax_sum(0.0f);

  vec<3, double> first_color(0.0f);

  // This linear solver is from Squish.
  for (uint i = 0; i < p.m_num_pixels; ++i) {
    uint8 c = p.m_pSelectors[i];

    double k;
    if (p.m_dxt1_selectors)
      k = g_dxt1_to_linear[c] * 1.0f / 3.0f;
    else
      k = g_dxt5_to_linear[c] * 1.0f / 7.0f;

    double alpha = 1.0f - k;
    double beta = k;

    vec<3, double> x;

    if (p.m_dxt1_selectors)
      x.set(p.m_pPixels[i][0] * 1.0f / 255.0f, p.m_pPixels[i][1] * 1.0f / 255.0f, p.m_pPixels[i][2] * 1.0f / 255.0f);
    else
      x.set(p.m_pPixels[i][p.m_alpha_comp_index] / 255.0f);

    if (!i)
      first_color = x;

    alpha2_sum += alpha * alpha;
    beta2_sum += beta * beta;
    alphabeta_sum += alpha * beta;
    alphax_sum += alpha * x;
    betax_sum += beta * x;
  }

  // zero where non-determinate
  vec<3, double> a, b;
  if (beta2_sum == 0.0f) {
    a = alphax_sum / alpha2_sum;
    b.clear();
  } else if (alpha2_sum == 0.0f) {
    a.clear();
    b = betax_sum / beta2_sum;
  } else {
    double factor = alpha2_sum * beta2_sum - alphabeta_sum * alphabeta_sum;
    if (factor != 0.0f) {
      a = (alphax_sum * beta2_sum - betax_sum * alphabeta_sum) / factor;
      b = (betax_sum * alpha2_sum - alphax_sum * alphabeta_sum) / factor;
    } else {
      a = first_color;
      b = first_color;
    }
  }

  vec3F l(0.0f), h(0.0f);
  l = a;
  h = b;

  l.clamp(0.0f, 1.0f);
  h.clamp(0.0f, 1.0f);

  if (p.m_dxt1_selectors)
    optimize_dxt1(l, h);
  else
    optimize_dxt5(l, h);

  return r.m_error < p.m_error_to_beat;
}